

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParserTest_StopAfterSyntaxIdentifier_Test::
~ParserTest_StopAfterSyntaxIdentifier_Test(ParserTest_StopAfterSyntaxIdentifier_Test *this)

{
  ParserTest_StopAfterSyntaxIdentifier_Test *this_local;
  
  ParserTest::~ParserTest(&this->super_ParserTest);
  return;
}

Assistant:

TEST_F(ParserTest, StopAfterSyntaxIdentifier) {
  SetupParser(
      "// blah\n"
      "syntax = \"foobar\";\n"
      "this line will not be parsed\n");
  parser_->SetStopAfterSyntaxIdentifier(true);
  EXPECT_TRUE(parser_->Parse(input_.get(), nullptr));
  EXPECT_EQ("", error_collector_.text_);
  EXPECT_EQ("foobar", parser_->GetSyntaxIdentifier());
}